

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVST3LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    iVar5 = 1;
    goto LAB_00153796;
  case 1:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x30) != 0) {
      return MCDisassembler_Fail;
    }
    uVar1 = Insn & 0x40;
    break;
  case 3:
    return MCDisassembler_Fail;
  }
  iVar5 = 2 - (uint)(uVar1 == 0);
LAB_00153796:
  uVar2 = Insn >> 0x10 & 0xf;
  uVar4 = Insn & 0xf;
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
  if (uVar4 == 0xf) {
    MCOperand_CreateImm0(Inst,0);
  }
  else {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
    MCOperand_CreateImm0(Inst,0);
    if (uVar4 == 0xd) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)GPRDecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar2);
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar1]);
  uVar1 = iVar5 + uVar1;
  lVar6 = 0;
  if (uVar1 < 0x20) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar1]);
    lVar6 = 3;
  }
  DVar3 = (*(code *)((long)&DAT_001d4a30 + (long)(int)(&DAT_001d4a30)[lVar6]))();
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVST3LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 4, 2))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}